

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

void store_reset(void)

{
  town_conflict *town;
  store *store;
  int iVar1;
  long lVar2;
  
  if (0 < world->num_towns) {
    lVar2 = 0;
    do {
      town = (town_conflict *)(world->towns + lVar2);
      store = town->stores;
      if (town->index == (int)player->home) {
        place_home(town);
      }
      else if (store->sidx == store_home_idx) {
        town->stores = store->next;
        free_store(store);
        store = town->stores;
      }
      for (; store != (store *)0x0; store = store->next) {
        store->stock_num = '\0';
        object_pile_free((chunk *)0x0,(chunk *)0x0,store->stock_k);
        object_pile_free((chunk *)0x0,(chunk *)0x0,store->stock);
        store->stock = (object *)0x0;
        store->stock_k = (object *)0x0;
        if (store->sidx != store_home_idx) {
          store_shuffle(store);
          iVar1 = 10;
          do {
            store_maint(store);
            iVar1 = iVar1 + -1;
          } while (iVar1 != 0);
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < world->num_towns);
  }
  return;
}

Assistant:

void store_reset(void) {
	int i, j;

	for (i = 0; i < world->num_towns; i++) {
		struct town *town = &world->towns[i];
		struct store *s = town->stores;

		/* Place the home in the hometown */
		if (town->index == player->home) {
			place_home(town);
		} else {
			/* May need to remove previous home for a dead character */
			if (store_is_home(s)) {
				town->stores = s->next;
				free_store(s);
				s = town->stores;
			}
		}

		/* Initial stock setup for stores */
		while (s) {
			s->stock_num = 0;
			object_pile_free(NULL, NULL, s->stock_k);
			object_pile_free(NULL, NULL, s->stock);
			s->stock_k = NULL;
			s->stock = NULL;
			if (store_is_home(s)) {
				s = s->next;
				continue;
			}
			store_shuffle(s);
			for (j = 0; j < 10; j++)
				store_maint(s);
			s = s->next;
		}
	}
}